

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::buildVertexInfoGUI
          (SurfaceVertexTangentVectorQuantity *this,size_t iV)

{
  vec2 *in_RDI;
  float fVar1;
  undefined1 auVar2 [64];
  size_t in_stack_00000040;
  stringstream buffer;
  vec2 vec;
  char *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  ostream *in_stack_fffffffffffffe30;
  stringstream local_1a0 [128];
  undefined1 extraout_var [56];
  
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted
            ((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  ImGui::NextColumn();
  auVar2._0_8_ = render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getValue
                           (_buffer,in_stack_00000040);
  auVar2._8_56_ = extraout_var;
  vmovlpd_avx(auVar2._0_16_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  polyscope::operator<<(in_stack_fffffffffffffe30,in_RDI);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  ImGui::TextUnformatted
            ((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  ImGui::NextColumn();
  ImGui::NextColumn();
  fVar1 = glm::length<2,float,(glm::qualifier)0>((vec<2,_float,_(glm::qualifier)0> *)0x48f51f);
  ImGui::Text((char *)(double)fVar1,"magnitude: %g");
  ImGui::NextColumn();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void SurfaceVertexTangentVectorQuantity::buildVertexInfoGUI(size_t iV) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();

  glm::vec2 vec = tangentVectors.getValue(iV);

  std::stringstream buffer;
  buffer << vec;
  ImGui::TextUnformatted(buffer.str().c_str());

  ImGui::NextColumn();
  ImGui::NextColumn();
  ImGui::Text("magnitude: %g", glm::length(vec));
  ImGui::NextColumn();
}